

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtabwidget.cpp
# Opt level: O1

void QTabWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  TabPosition TVar1;
  TabShape TVar2;
  long *plVar3;
  QSize *pQVar4;
  bool bVar5;
  int iVar6;
  TextElideMode TVar7;
  QTabWidgetPrivate *d;
  undefined8 *puVar8;
  QSize QVar9;
  QTabBar *this;
  QTabWidgetPrivate *this_00;
  long in_FS_OFFSET;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_4c = *_a[1];
    iVar6 = 0;
    break;
  case 1:
    local_4c = *_a[1];
    iVar6 = 1;
    break;
  case 2:
    local_4c = *_a[1];
    iVar6 = 2;
    break;
  case 3:
    local_4c = *_a[1];
    iVar6 = 3;
    break;
  case 4:
    iVar6 = *_a[1];
    this = *(QTabBar **)(*(long *)(_o + 8) + 600);
    goto LAB_004b3dc1;
  case 5:
    this = *(QTabBar **)(*(long *)(_o + 8) + 600);
    iVar6 = QStackedWidget::indexOf(*(QStackedWidget **)(*(long *)(_o + 8) + 0x260),*_a[1]);
LAB_004b3dc1:
    QTabBar::setCurrentIndex(this,iVar6);
  default:
    goto switchD_004b3ca0_default;
  }
  puStack_40 = &local_4c;
  local_48 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar6,&local_48);
switchD_004b3ca0_default:
  switch(_c) {
  case ReadProperty:
switchD_004b3c84_caseD_1:
    if (10 < (uint)_id) goto LAB_004b3fbd;
    break;
  case WriteProperty:
    goto switchD_004b3c84_caseD_2;
  default:
    goto switchD_004b3c84_caseD_3;
  case IndexOfMethod:
switchD_004b3c84_caseD_5:
    plVar3 = (long *)_a[1];
    if (((code *)*plVar3 == currentChanged) && (plVar3[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_004b3c84_caseD_3;
    }
    if (((code *)*plVar3 == tabCloseRequested) && (plVar3[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_004b3c84_caseD_3;
    }
    if (((code *)*plVar3 == tabBarClicked) && (plVar3[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_004b3c84_caseD_3;
    }
    if (((code *)*plVar3 == tabBarDoubleClicked) && (plVar3[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_004b3c84_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_004b3c84_caseD_3;
      goto switchD_004b3c84_caseD_1;
    }
    goto switchD_004b3c84_caseD_2;
  case RegisterMethodArgumentMetaType:
    if (_id == 5) {
      puVar8 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_004b3e04;
      *puVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
    }
    else {
      puVar8 = (undefined8 *)*_a;
LAB_004b3e04:
      *puVar8 = 0;
    }
    if (_c == ReadProperty) goto switchD_004b3c84_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_004b3c84_caseD_3;
      goto switchD_004b3c84_caseD_5;
    }
    goto switchD_004b3c84_caseD_2;
  }
  pQVar4 = (QSize *)*_a;
  switch(_id) {
  case 0:
    TVar7 = *(TextElideMode *)(*(long *)(_o + 8) + 0x27c);
    break;
  case 1:
    TVar7 = *(TextElideMode *)(*(long *)(_o + 8) + 0x280);
    break;
  case 2:
    TVar7 = QTabBar::currentIndex(*(QTabBar **)(*(long *)(_o + 8) + 600));
    break;
  case 3:
    TVar7 = QTabBar::count(*(QTabBar **)(*(long *)(_o + 8) + 600));
    break;
  case 4:
    QVar9 = QTabBar::iconSize(*(QTabBar **)(*(long *)(_o + 8) + 600));
    *pQVar4 = QVar9;
    goto LAB_004b3fbd;
  case 5:
    TVar7 = QTabBar::elideMode(*(QTabBar **)(*(long *)(_o + 8) + 600));
    break;
  case 6:
    bVar5 = QTabBar::usesScrollButtons(*(QTabBar **)(*(long *)(_o + 8) + 600));
    goto LAB_004b3fb9;
  case 7:
    if (*(QTabBar **)(*(long *)(_o + 8) + 600) == (QTabBar *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = QTabBar::documentMode(*(QTabBar **)(*(long *)(_o + 8) + 600));
    }
    *(bool *)&(pQVar4->wd).m_i = bVar5;
    goto LAB_004b3fbd;
  case 8:
    bVar5 = QTabBar::tabsClosable(*(QTabBar **)(*(long *)(_o + 8) + 600));
    goto LAB_004b3fb9;
  case 9:
    bVar5 = QTabBar::isMovable(*(QTabBar **)(*(long *)(_o + 8) + 600));
    goto LAB_004b3fb9;
  case 10:
    bVar5 = QTabBar::autoHide(*(QTabBar **)(*(long *)(_o + 8) + 600));
LAB_004b3fb9:
    *(bool *)&(pQVar4->wd).m_i = bVar5;
    goto LAB_004b3fbd;
  }
  (pQVar4->wd).m_i = TVar7;
LAB_004b3fbd:
  if (_c != WriteProperty) goto switchD_004b3c84_caseD_3;
switchD_004b3c84_caseD_2:
  if (10 < (uint)_id) goto switchD_004b3c84_caseD_3;
  pQVar4 = (QSize *)*_a;
  switch(_id) {
  case 0:
    TVar1 = (pQVar4->wd).m_i;
    this_00 = *(QTabWidgetPrivate **)(_o + 8);
    if (this_00->pos == TVar1) break;
    this_00->pos = TVar1;
    goto LAB_004b4043;
  case 1:
    TVar2 = (pQVar4->wd).m_i;
    this_00 = *(QTabWidgetPrivate **)(_o + 8);
    if (this_00->shape == TVar2) break;
    this_00->shape = TVar2;
LAB_004b4043:
    QTabWidgetPrivate::updateTabBarPosition(this_00);
    break;
  case 2:
    QTabBar::setCurrentIndex(*(QTabBar **)(*(long *)(_o + 8) + 600),(pQVar4->wd).m_i);
    break;
  case 4:
    QTabBar::setIconSize(*(QTabBar **)(*(long *)(_o + 8) + 600),pQVar4);
    break;
  case 5:
    QTabBar::setElideMode(*(QTabBar **)(*(long *)(_o + 8) + 600),(pQVar4->wd).m_i);
    break;
  case 6:
    QTabBar::setUsesScrollButtons(*(QTabBar **)(*(long *)(_o + 8) + 600),SUB41((pQVar4->wd).m_i,0));
    break;
  case 7:
    setDocumentMode((QTabWidget *)_o,SUB41((pQVar4->wd).m_i,0));
    break;
  case 8:
    setTabsClosable((QTabWidget *)_o,SUB41((pQVar4->wd).m_i,0));
    break;
  case 9:
    QTabBar::setMovable(*(QTabBar **)(*(long *)(_o + 8) + 600),SUB41((pQVar4->wd).m_i,0));
    break;
  case 10:
    QTabBar::setAutoHide(*(QTabBar **)(*(long *)(_o + 8) + 600),SUB41((pQVar4->wd).m_i,0));
  }
switchD_004b3c84_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTabWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->tabCloseRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->tabBarClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->tabBarDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setCurrentWidget((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::currentChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabCloseRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabBarClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabWidget::*)(int )>(_a, &QTabWidget::tabBarDoubleClicked, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<TabPosition*>(_v) = _t->tabPosition(); break;
        case 1: *reinterpret_cast<TabShape*>(_v) = _t->tabShape(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 4: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 5: *reinterpret_cast<Qt::TextElideMode*>(_v) = _t->elideMode(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->usesScrollButtons(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->tabsClosable(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isMovable(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->tabBarAutoHide(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTabPosition(*reinterpret_cast<TabPosition*>(_v)); break;
        case 1: _t->setTabShape(*reinterpret_cast<TabShape*>(_v)); break;
        case 2: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 5: _t->setElideMode(*reinterpret_cast<Qt::TextElideMode*>(_v)); break;
        case 6: _t->setUsesScrollButtons(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setTabsClosable(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setMovable(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setTabBarAutoHide(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}